

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O0

void Imf_3_4::anon_unknown_6::writePixelData
               (OutputStreamMutex *filedata,Data *partdata,int lineBufferMinY,char *pixelData,
               uint64_t packedDataSize,uint64_t unpackedDataSize,char *sampleCountTableData,
               uint64_t sampleCountTableSize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  reference pvVar5;
  undefined8 in_RCX;
  long in_RSI;
  long in_RDI;
  ulong in_R8;
  undefined8 in_stack_00000008;
  ulong in_stack_00000010;
  uint64_t currentPosition;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  OStream *in_stack_ffffffffffffffa0;
  undefined8 local_38;
  
  local_38 = *(value_type *)(in_RDI + 0x30);
  *(undefined8 *)(in_RDI + 0x30) = 0;
  if (local_38 == 0) {
    local_38 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x18))();
  }
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 0xd0),
                      (long)((*(int *)(in_RSI + 0xb0) - *(int *)(in_RSI + 0xc4)) /
                            *(int *)(in_RSI + 0x140)));
  *pvVar5 = local_38;
  if ((*(byte *)(in_RSI + 0x3c) & 1) != 0) {
    Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  }
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>
            (in_stack_ffffffffffffffa0,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
            );
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>
            (in_stack_ffffffffffffffa0,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
            );
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>
            (in_stack_ffffffffffffffa0,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
            );
  (**(code **)(**(long **)(in_RDI + 0x28) + 0x10))
            (*(long **)(in_RDI + 0x28),in_stack_00000008,in_stack_00000010 & 0xffffffff);
  (**(code **)(**(long **)(in_RDI + 0x28) + 0x10))
            (*(long **)(in_RDI + 0x28),in_RCX,in_R8 & 0xffffffff);
  iVar1 = Xdr::size<int>();
  iVar2 = Xdr::size<unsigned_long>();
  iVar3 = Xdr::size<unsigned_long>();
  iVar4 = Xdr::size<unsigned_long>();
  *(value_type *)(in_RDI + 0x30) =
       local_38 + (long)iVar1 + (long)iVar2 + (long)iVar3 + (long)iVar4 + in_stack_00000010 + in_R8;
  if ((*(byte *)(in_RSI + 0x3c) & 1) != 0) {
    iVar1 = Xdr::size<int>();
    *(long *)(in_RDI + 0x30) = (long)iVar1 + *(long *)(in_RDI + 0x30);
  }
  return;
}

Assistant:

void
writePixelData (
    OutputStreamMutex*            filedata,
    DeepScanLineOutputFile::Data* partdata,
    int                           lineBufferMinY,
    const char                    pixelData[],
    uint64_t                      packedDataSize,
    uint64_t                      unpackedDataSize,
    const char                    sampleCountTableData[],
    uint64_t                      sampleCountTableSize)
{
    //
    // Store a block of pixel data in the output file, and try
    // to keep track of the current writing position the file
    // without calling tellp() (tellp() can be fairly expensive).
    //

    uint64_t currentPosition  = filedata->currentPosition;
    filedata->currentPosition = 0;

    if (currentPosition == 0) currentPosition = filedata->os->tellp ();

    partdata->lineOffsets
        [(partdata->currentScanLine - partdata->minY) /
         partdata->linesInBuffer] = currentPosition;

#ifdef DEBUG

    assert (filedata->os->tellp () == currentPosition);

#endif

    //
    // Write the optional part number.
    //

    if (partdata->multipart)
    {
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
            OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
            *filedata->os, partdata->partNumber);
    }

    //
    // Write the y coordinate of the first scanline in the chunk.
    //

    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
        *filedata->os, lineBufferMinY);

    //
    // Write the packed size of the pixel sample count table.
    //

    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
        *filedata->os, sampleCountTableSize);

    //
    // Write the packed pixel data size.
    //

    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
        *filedata->os, packedDataSize);

    //
    // Write the unpacked pixel data size.
    //

    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
        *filedata->os, unpackedDataSize);

    //
    // Write the packed pixel sample count table.
    //

    filedata->os->write (
        sampleCountTableData, static_cast<int> (sampleCountTableSize));

    //
    // Write the compressed data.
    //

    filedata->os->write (pixelData, static_cast<int> (packedDataSize));

    //
    // Update stream position.
    //

    filedata->currentPosition =
        currentPosition + Xdr::size<int> () + // y coordinate
        Xdr::size<uint64_t> () +              // packed sample count table size
        Xdr::size<uint64_t> () +              // packed data size
        Xdr::size<uint64_t> () +              // unpacked data size
        sampleCountTableSize +                // pixel sample count table
        packedDataSize;                       // pixel data

    if (partdata->multipart)
    {
        filedata->currentPosition += Xdr::size<int> (); // optional part number
    }
}